

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetNetworkByXpan
          (Registry *this,uint64_t aXpan,Network *aRet)

{
  Status SVar1;
  undefined1 local_80 [8];
  Network nwk;
  Network *aRet_local;
  uint64_t aXpan_local;
  Registry *this_local;
  
  nwk._88_8_ = aRet;
  Network::Network((Network *)local_80);
  nwk.mName.field_2._8_8_ = aXpan;
  SVar1 = LookupOne(this,(Network *)local_80,(Network *)nwk._88_8_);
  Network::~Network((Network *)local_80);
  return SVar1;
}

Assistant:

Registry::Status Registry::GetNetworkByXpan(uint64_t aXpan, Network &aRet)
{
    Network nwk{};
    nwk.mXpan = aXpan;
    return LookupOne(nwk, aRet);
}